

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O2

matrix<trng::GF2,_4UL> *
trng::operator*(matrix<trng::GF2,_4UL> *__return_storage_ptr__,matrix<trng::GF2,_4UL> *a,
               matrix<trng::GF2,_4UL> *b)

{
  pointer pGVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  size_type j_1;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  
  matrix<trng::GF2,_4UL>::matrix(__return_storage_ptr__);
  bVar3 = true;
  uVar2 = 0;
  while (bVar3) {
    lVar4 = 0;
    for (lVar6 = 0; uVar5 = uVar2, lVar6 != 4; lVar6 = lVar6 + 1) {
      for (; uVar5 < 4; uVar5 = uVar5 + 1) {
        (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar5 + lVar4].value = '\0';
      }
      lVar4 = lVar4 + 4;
    }
    bVar3 = true;
    uVar5 = 0;
    while (bVar3) {
      lVar4 = 0;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        for (uVar7 = uVar2; uVar7 < 4; uVar7 = uVar7 + 1) {
          bVar8 = 0;
          for (uVar9 = uVar5; uVar9 < 4; uVar9 = uVar9 + 1) {
            bVar8 = bVar8 ^ (b->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar9 * 4 + uVar7].value &
                            (a->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar9 + lVar4].value;
          }
          pGVar1 = (__return_storage_ptr__->data).
                   super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar7 + lVar6 * 4;
          pGVar1->value = pGVar1->value ^ bVar8;
        }
        lVar4 = lVar4 + 4;
      }
      bVar3 = false;
      uVar5 = 0x20;
    }
    bVar3 = false;
    uVar2 = 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }